

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_add op;
  int local_1cc;
  undefined8 *local_1b8;
  undefined8 *local_1a8;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  
  local_1cc = 0;
  fVar1 = *in_RSI;
  auVar2 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x30);
  auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
  local_1b8 = in_RDX;
  local_1a8 = in_RDI;
  for (; local_1cc + 7 < in_ECX * in_R8D; local_1cc = local_1cc + 8) {
    local_e0 = (float)*local_1a8;
    fStack_dc = (float)((ulong)*local_1a8 >> 0x20);
    fStack_d8 = (float)local_1a8[1];
    fStack_d4 = (float)((ulong)local_1a8[1] >> 0x20);
    fStack_d0 = (float)local_1a8[2];
    fStack_cc = (float)((ulong)local_1a8[2] >> 0x20);
    fStack_c8 = (float)local_1a8[3];
    fStack_c4 = (float)((ulong)local_1a8[3] >> 0x20);
    local_100 = auVar3._0_4_;
    fStack_fc = auVar3._4_4_;
    fStack_f8 = auVar3._8_4_;
    fStack_f4 = auVar3._12_4_;
    fStack_f0 = auVar2._0_4_;
    fStack_ec = auVar2._4_4_;
    fStack_e8 = auVar2._8_4_;
    fStack_e4 = auVar2._12_4_;
    *local_1b8 = CONCAT44(fStack_dc + fStack_fc,local_e0 + local_100);
    local_1b8[1] = CONCAT44(fStack_d4 + fStack_f4,fStack_d8 + fStack_f8);
    local_1b8[2] = CONCAT44(fStack_cc + fStack_ec,fStack_d0 + fStack_f0);
    local_1b8[3] = CONCAT44(fStack_c4 + fStack_e4,fStack_c8 + fStack_e8);
    local_1a8 = local_1a8 + 4;
    local_1b8 = local_1b8 + 4;
  }
  fVar1 = *in_RSI;
  for (; local_1cc + 3 < in_ECX * in_R8D; local_1cc = local_1cc + 4) {
    local_b0 = (float)*local_1a8;
    fStack_ac = (float)((ulong)*local_1a8 >> 0x20);
    fStack_a8 = (float)local_1a8[1];
    fStack_a4 = (float)((ulong)local_1a8[1] >> 0x20);
    *local_1b8 = CONCAT44(fStack_ac + fVar1,local_b0 + fVar1);
    local_1b8[1] = CONCAT44(fStack_a4 + fVar1,fStack_a8 + fVar1);
    local_1a8 = local_1a8 + 2;
    local_1b8 = local_1b8 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}